

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ResultBuilder::ResultBuilder
          (ResultBuilder *this,Enum at,char *file,int line,char *expr,char *exception_type,
          String *exception_string)

{
  StringContains local_58;
  char *local_38;
  char *exception_type_local;
  char *expr_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  ResultBuilder *pRStack_10;
  Enum at_local;
  ResultBuilder *this_local;
  
  local_38 = exception_type;
  exception_type_local = expr;
  expr_local._4_4_ = line;
  pcStack_20 = file;
  file_local._4_4_ = at;
  pRStack_10 = this;
  AssertData::StringContains::StringContains(&local_58,exception_string);
  AssertData::AssertData(&this->super_AssertData,at,file,line,expr,exception_type,&local_58);
  AssertData::StringContains::~StringContains(&local_58);
  return;
}

Assistant:

ResultBuilder::ResultBuilder(assertType::Enum at, const char* file, int line, const char* expr,
                                 const char* exception_type, const String& exception_string)
        : AssertData(at, file, line, expr, exception_type, exception_string) { }